

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O0

long __thiscall DISTRHO::PluginExporter::getUniqueId(PluginExporter *this)

{
  int iVar1;
  undefined4 extraout_var;
  PluginExporter *this_local;
  
  if (this->fPlugin == (Plugin *)0x0) {
    d_safe_assert("fPlugin != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
                  ,0x1d8);
    this_local = (PluginExporter *)0x0;
  }
  else {
    iVar1 = (*this->fPlugin->_vptr_Plugin[9])();
    this_local = (PluginExporter *)CONCAT44(extraout_var,iVar1);
  }
  return (long)this_local;
}

Assistant:

long getUniqueId() const noexcept
    {
        DISTRHO_SAFE_ASSERT_RETURN(fPlugin != nullptr, 0);

        return fPlugin->getUniqueId();
    }